

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fparith(ASMState *as,IRIns *ir,x86Op xo)

{
  byte bVar1;
  uint uVar2;
  Reg rr;
  int iVar3;
  Reg local_30;
  IRRef tmp;
  Reg right;
  Reg dest;
  RegSet allow;
  IRRef rref;
  IRRef lref;
  x86Op xo_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  allow = (RegSet)(ir->field_0).op1;
  uVar2 = (uint)(ir->field_0).op2;
  right = 0xffff0000;
  bVar1 = *(byte *)((long)as->ir + (ulong)uVar2 * 8 + 6);
  if ((bVar1 & 0x80) == 0) {
    right = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & 0xffff0000;
    as->weakset = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & as->weakset;
  }
  rr = ra_dest(as,ir,right);
  local_30 = rr;
  if ((allow != uVar2) && (local_30 = (uint)bVar1, (bVar1 & 0x80) != 0)) {
    iVar3 = asm_swapops(as,ir);
    dest = uVar2;
    if (iVar3 != 0) {
      dest = allow;
      allow = uVar2;
    }
    local_30 = asm_fuseload(as,dest,(1 << ((byte)rr & 0x1f) ^ 0xffffffffU) & right);
  }
  emit_mrm(as,xo,rr,local_30);
  ra_left(as,rr,allow);
  return;
}

Assistant:

static void asm_fparith(ASMState *as, IRIns *ir, x86Op xo)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_FPR;
  Reg dest;
  Reg right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseload(as, rref, rset_clear(allow, dest));
  }
  emit_mrm(as, xo, dest, right);
  ra_left(as, dest, lref);
}